

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log4z.cpp
# Opt level: O0

bool __thiscall zsummer::log4z::CThread::Wait(CThread *this)

{
  int iVar1;
  CThread *this_local;
  
  iVar1 = pthread_join(this->m_hThreadID,(void **)0x0);
  return iVar1 == 0;
}

Assistant:

bool Wait()
	{
#ifdef WIN32
		if (WaitForSingleObject((HANDLE)m_hThreadID, INFINITE) != WAIT_OBJECT_0)
		{
			return false;
		}
#else
		if (pthread_join((pthread_t)m_hThreadID, NULL) != 0)
		{
			return false;
		}
#endif
		return true;
	}